

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O3

void __thiscall
Importer_accessImportedModelLibrary_Test::TestBody(Importer_accessImportedModelLibrary_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char cVar3;
  char *pcVar4;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  ModelPtr left;
  AssertionResult gtest_ar_5;
  ImporterPtr importer;
  ModelPtr right;
  PrinterPtr printer;
  ModelPtr model;
  ModelPtr point;
  ParserPtr parser;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  long *local_e0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  long local_d0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  AssertHelper local_a0 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  internal local_90 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  shared_ptr *local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  undefined8 local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  bool local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  string local_50 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  string local_40 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  undefined1 local_30 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  libcellml::Parser::create(SUB81(local_30,0));
  local_e0 = local_d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"importer/diamond.cellml","");
  fileContents((string *)&local_100);
  libcellml::Parser::parseModel(local_50);
  paVar1 = &local_100.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_100._M_dataplus._M_p._1_7_,(char)local_100._M_dataplus._M_p) != paVar1) {
    operator_delete((undefined1 *)
                    CONCAT71(local_100._M_dataplus._M_p._1_7_,(char)local_100._M_dataplus._M_p),
                    local_100.field_2._M_allocated_capacity + 1);
  }
  if (local_e0 != local_d0) {
    operator_delete(local_e0,local_d0[0] + 1);
  }
  libcellml::Importer::create(SUB81(&local_80,0));
  libcellml::Printer::create();
  local_e0 = local_d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"importer/","");
  resourcePath((string *)&local_100);
  libcellml::Importer::resolveImports(local_80,local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_100._M_dataplus._M_p._1_7_,(char)local_100._M_dataplus._M_p) != paVar1) {
    operator_delete((undefined1 *)
                    CONCAT71(local_100._M_dataplus._M_p._1_7_,(char)local_100._M_dataplus._M_p),
                    local_100.field_2._M_allocated_capacity + 1);
  }
  if (local_e0 != local_d0) {
    operator_delete(local_e0,local_d0[0] + 1);
  }
  cVar3 = libcellml::Model::hasUnresolvedImports();
  local_e0 = (long *)(CONCAT71(local_e0._1_7_,cVar3) ^ 1);
  local_d8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar3 != '\0') {
    testing::Message::Message((Message *)&local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_100,(char *)&local_e0,"model->hasUnresolvedImports()",
               "true");
    testing::internal::AssertHelper::AssertHelper
              (local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x140,(char *)CONCAT71(local_100._M_dataplus._M_p._1_7_,
                                       (char)local_100._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(local_a0,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper(local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_100._M_dataplus._M_p._1_7_,(char)local_100._M_dataplus._M_p) != paVar1) {
      operator_delete((undefined1 *)
                      CONCAT71(local_100._M_dataplus._M_p._1_7_,(char)local_100._M_dataplus._M_p),
                      local_100.field_2._M_allocated_capacity + 1);
    }
    if ((long *)local_c0._M_dataplus._M_p != (long *)0x0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') && ((long *)local_c0._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_c0._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_e0 = (long *)0x3;
  local_c0._M_dataplus._M_p = (pointer)libcellml::Importer::libraryCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_100,"size_t(3)","importer->libraryCount()",
             (unsigned_long *)&local_e0,(unsigned_long *)&local_c0);
  if ((char)local_100._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_e0);
    if ((undefined8 *)local_100._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_100._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x143,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c0,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c0);
    if (local_e0 != (long *)0x0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') && (local_e0 != (long *)0x0)) {
        (**(code **)(*local_e0 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_100._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_e0 = local_d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e0,"importer/diamond_left.cellml","");
  resourcePath((string *)&local_100);
  local_70 = 0;
  libcellml::Importer::key_abi_cxx11_((ulong *)&local_c0);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)local_a0,"resourcePath(\"importer/diamond_left.cellml\")",
             "importer->key(0)",&local_100,&local_c0);
  paVar2 = &local_c0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_100._M_dataplus._M_p._1_7_,(char)local_100._M_dataplus._M_p) != paVar1) {
    operator_delete((undefined1 *)
                    CONCAT71(local_100._M_dataplus._M_p._1_7_,(char)local_100._M_dataplus._M_p),
                    local_100.field_2._M_allocated_capacity + 1);
  }
  if (local_e0 != local_d0) {
    operator_delete(local_e0,local_d0[0] + 1);
  }
  if (local_a0[0] == (AssertHelper)0x0) {
    testing::Message::Message((Message *)&local_100);
    if (local_98.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_98.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x146,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e0,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e0);
    if (CONCAT71(local_100._M_dataplus._M_p._1_7_,(char)local_100._M_dataplus._M_p) != 0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') &&
         ((long *)CONCAT71(local_100._M_dataplus._M_p._1_7_,(char)local_100._M_dataplus._M_p) !=
          (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_100._M_dataplus._M_p._1_7_,
                                       (char)local_100._M_dataplus._M_p) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_98,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_e0 = local_d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e0,"importer/diamond_point.cellml","");
  resourcePath((string *)&local_100);
  local_70 = 1;
  libcellml::Importer::key_abi_cxx11_((ulong *)&local_c0);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)local_a0,"resourcePath(\"importer/diamond_point.cellml\")",
             "importer->key(1)",&local_100,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_100._M_dataplus._M_p._1_7_,(char)local_100._M_dataplus._M_p) != paVar1) {
    operator_delete((undefined1 *)
                    CONCAT71(local_100._M_dataplus._M_p._1_7_,(char)local_100._M_dataplus._M_p),
                    local_100.field_2._M_allocated_capacity + 1);
  }
  if (local_e0 != local_d0) {
    operator_delete(local_e0,local_d0[0] + 1);
  }
  if (local_a0[0] == (AssertHelper)0x0) {
    testing::Message::Message((Message *)&local_100);
    if (local_98.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_98.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x147,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e0,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e0);
    if (CONCAT71(local_100._M_dataplus._M_p._1_7_,(char)local_100._M_dataplus._M_p) != 0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') &&
         ((long *)CONCAT71(local_100._M_dataplus._M_p._1_7_,(char)local_100._M_dataplus._M_p) !=
          (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_100._M_dataplus._M_p._1_7_,
                                       (char)local_100._M_dataplus._M_p) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_98,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_e0 = local_d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e0,"importer/diamond_right.cellml","");
  resourcePath((string *)&local_100);
  local_70 = 2;
  libcellml::Importer::key_abi_cxx11_((ulong *)&local_c0);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)local_a0,"resourcePath(\"importer/diamond_right.cellml\")",
             "importer->key(2)",&local_100,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_100._M_dataplus._M_p._1_7_,(char)local_100._M_dataplus._M_p) != paVar1) {
    operator_delete((undefined1 *)
                    CONCAT71(local_100._M_dataplus._M_p._1_7_,(char)local_100._M_dataplus._M_p),
                    local_100.field_2._M_allocated_capacity + 1);
  }
  if (local_e0 != local_d0) {
    operator_delete(local_e0,local_d0[0] + 1);
  }
  if (local_a0[0] == (AssertHelper)0x0) {
    testing::Message::Message((Message *)&local_100);
    if (local_98.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_98.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x148,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e0,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e0);
    if (CONCAT71(local_100._M_dataplus._M_p._1_7_,(char)local_100._M_dataplus._M_p) != 0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') &&
         ((long *)CONCAT71(local_100._M_dataplus._M_p._1_7_,(char)local_100._M_dataplus._M_p) !=
          (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_100._M_dataplus._M_p._1_7_,
                                       (char)local_100._M_dataplus._M_p) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_98,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_c0._M_dataplus._M_p = (pointer)0x3e7;
  libcellml::Importer::key_abi_cxx11_((ulong *)&local_100);
  pcVar4 = "";
  testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
            ((internal *)&local_e0,"\"\"","importer->key(999)",(char (*) [1])0x15b2ef,&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_100._M_dataplus._M_p._1_7_,(char)local_100._M_dataplus._M_p) != paVar1) {
    operator_delete((undefined1 *)
                    CONCAT71(local_100._M_dataplus._M_p._1_7_,(char)local_100._M_dataplus._M_p),
                    local_100.field_2._M_allocated_capacity + 1);
  }
  if (local_e0._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_100);
    if (local_d8.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = ((local_d8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x149,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c0,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c0);
    if (CONCAT71(local_100._M_dataplus._M_p._1_7_,(char)local_100._M_dataplus._M_p) != 0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') &&
         ((long *)CONCAT71(local_100._M_dataplus._M_p._1_7_,(char)local_100._M_dataplus._M_p) !=
          (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_100._M_dataplus._M_p._1_7_,
                                       (char)local_100._M_dataplus._M_p) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_e0 = local_d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e0,"importer/diamond_left.cellml","");
  resourcePath((string *)&local_100);
  libcellml::Importer::library((string *)local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_100._M_dataplus._M_p._1_7_,(char)local_100._M_dataplus._M_p) != paVar1) {
    operator_delete((undefined1 *)
                    CONCAT71(local_100._M_dataplus._M_p._1_7_,(char)local_100._M_dataplus._M_p),
                    local_100.field_2._M_allocated_capacity + 1);
  }
  if (local_e0 != local_d0) {
    operator_delete(local_e0,local_d0[0] + 1);
  }
  local_e0 = local_d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e0,"importer/diamond_right.cellml","");
  resourcePath((string *)&local_100);
  libcellml::Importer::library((string *)&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_100._M_dataplus._M_p._1_7_,(char)local_100._M_dataplus._M_p) != paVar1) {
    operator_delete((undefined1 *)
                    CONCAT71(local_100._M_dataplus._M_p._1_7_,(char)local_100._M_dataplus._M_p),
                    local_100.field_2._M_allocated_capacity + 1);
  }
  if (local_e0 != local_d0) {
    operator_delete(local_e0,local_d0[0] + 1);
  }
  local_e0 = local_d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e0,"importer/diamond_point.cellml","");
  resourcePath((string *)&local_100);
  libcellml::Importer::library(local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_100._M_dataplus._M_p._1_7_,(char)local_100._M_dataplus._M_p) != paVar1) {
    operator_delete((undefined1 *)
                    CONCAT71(local_100._M_dataplus._M_p._1_7_,(char)local_100._M_dataplus._M_p),
                    local_100.field_2._M_allocated_capacity + 1);
  }
  if (local_e0 != local_d0) {
    operator_delete(local_e0,local_d0[0] + 1);
  }
  local_e0 = local_d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e0,"importer/diamond_left.cellml","");
  fileContents((string *)&local_100);
  libcellml::Printer::printModel_abi_cxx11_((shared_ptr *)&local_c0,local_60);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_90,"fileContents(\"importer/diamond_left.cellml\")","printer->printModel(left)",
             &local_100,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_100._M_dataplus._M_p._1_7_,(char)local_100._M_dataplus._M_p) != paVar1) {
    operator_delete((undefined1 *)
                    CONCAT71(local_100._M_dataplus._M_p._1_7_,(char)local_100._M_dataplus._M_p),
                    local_100.field_2._M_allocated_capacity + 1);
  }
  if (local_e0 != local_d0) {
    operator_delete(local_e0,local_d0[0] + 1);
  }
  if (local_90[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_100);
    if (local_88.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_88.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x151,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e0,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e0);
    if (CONCAT71(local_100._M_dataplus._M_p._1_7_,(char)local_100._M_dataplus._M_p) != 0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') &&
         ((long *)CONCAT71(local_100._M_dataplus._M_p._1_7_,(char)local_100._M_dataplus._M_p) !=
          (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_100._M_dataplus._M_p._1_7_,
                                       (char)local_100._M_dataplus._M_p) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_e0 = local_d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e0,"importer/diamond_right.cellml","");
  fileContents((string *)&local_100);
  libcellml::Printer::printModel_abi_cxx11_((shared_ptr *)&local_c0,local_60);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_90,"fileContents(\"importer/diamond_right.cellml\")","printer->printModel(right)"
             ,&local_100,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_100._M_dataplus._M_p._1_7_,(char)local_100._M_dataplus._M_p) != paVar1) {
    operator_delete((undefined1 *)
                    CONCAT71(local_100._M_dataplus._M_p._1_7_,(char)local_100._M_dataplus._M_p),
                    local_100.field_2._M_allocated_capacity + 1);
  }
  if (local_e0 != local_d0) {
    operator_delete(local_e0,local_d0[0] + 1);
  }
  if (local_90[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_100);
    if (local_88.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_88.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x152,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e0,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e0);
    if (CONCAT71(local_100._M_dataplus._M_p._1_7_,(char)local_100._M_dataplus._M_p) != 0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') &&
         ((long *)CONCAT71(local_100._M_dataplus._M_p._1_7_,(char)local_100._M_dataplus._M_p) !=
          (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_100._M_dataplus._M_p._1_7_,
                                       (char)local_100._M_dataplus._M_p) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_e0 = local_d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e0,"importer/diamond_point.cellml","");
  fileContents((string *)&local_100);
  libcellml::Printer::printModel_abi_cxx11_((shared_ptr *)&local_c0,local_60);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_90,"fileContents(\"importer/diamond_point.cellml\")","printer->printModel(point)"
             ,&local_100,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_100._M_dataplus._M_p._1_7_,(char)local_100._M_dataplus._M_p) != paVar1) {
    operator_delete((undefined1 *)
                    CONCAT71(local_100._M_dataplus._M_p._1_7_,(char)local_100._M_dataplus._M_p),
                    local_100.field_2._M_allocated_capacity + 1);
  }
  if (local_e0 != local_d0) {
    operator_delete(local_e0,local_d0[0] + 1);
  }
  if (local_90[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_100);
    if (local_88.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_88.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x153,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e0,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e0);
    if (CONCAT71(local_100._M_dataplus._M_p._1_7_,(char)local_100._M_dataplus._M_p) != 0) {
      cVar3 = testing::internal::IsTrue(true);
      if ((cVar3 != '\0') &&
         ((long *)CONCAT71(local_100._M_dataplus._M_p._1_7_,(char)local_100._M_dataplus._M_p) !=
          (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_100._M_dataplus._M_p._1_7_,
                                       (char)local_100._M_dataplus._M_p) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
  }
  if (local_98.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98.ptr_);
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
  }
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  return;
}

Assistant:

TEST(Importer, accessImportedModelLibrary)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("importer/diamond.cellml"));
    auto importer = libcellml::Importer::create();
    auto printer = libcellml::Printer::create();

    importer->resolveImports(model, resourcePath("importer/"));
    EXPECT_FALSE(model->hasUnresolvedImports());

    // Library should contain left, right, and one instance (not two) of the point.
    EXPECT_EQ(size_t(3), importer->libraryCount());

    // Test that the library items have the expected keys.
    EXPECT_EQ(resourcePath("importer/diamond_left.cellml"), importer->key(0));
    EXPECT_EQ(resourcePath("importer/diamond_point.cellml"), importer->key(1));
    EXPECT_EQ(resourcePath("importer/diamond_right.cellml"), importer->key(2));
    EXPECT_EQ("", importer->key(999));

    // Access library items by their URL.
    auto left = importer->library(resourcePath("importer/diamond_left.cellml"));
    auto right = importer->library(resourcePath("importer/diamond_right.cellml"));
    auto point = importer->library(resourcePath("importer/diamond_point.cellml"));

    // Test that the library items are the same as those in the files.
    EXPECT_EQ(fileContents("importer/diamond_left.cellml"), printer->printModel(left));
    EXPECT_EQ(fileContents("importer/diamond_right.cellml"), printer->printModel(right));
    EXPECT_EQ(fileContents("importer/diamond_point.cellml"), printer->printModel(point));
}